

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# candela.cpp
# Opt level: O0

void candella::loop(void)

{
  int32_t max_brightness;
  pointer ppVar1;
  ostream *poVar2;
  int *piVar3;
  iterator __position;
  undefined8 in_RCX;
  nfds_t __nfds;
  size_t extraout_XMM0_Qa;
  action_type local_374;
  duration<unsigned_long,_std::ratio<1L,_1000L>_> local_370;
  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  local_368;
  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<unsigned_long,_std::ratio<1L,_1000000000L>_>_>
  local_360;
  _Rb_tree_iterator<std::pair<const_std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>,_candella::action_type>_>
  local_358;
  _Base_ptr local_350;
  action_type local_344;
  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  local_340;
  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  local_338;
  _Base_ptr local_330;
  action_type local_324;
  duration<unsigned_long,_std::ratio<1L,_1000L>_> local_320;
  duration<unsigned_long,_std::ratio<1L,_1000L>_> local_318;
  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  local_310;
  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<unsigned_long,_std::ratio<1L,_1000000000L>_>_>
  local_308;
  unsigned_long local_300;
  size_t i;
  double ambient_light;
  _Rb_tree_iterator<std::pair<const_std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>,_candella::action_type>_>
  local_2e8;
  int local_2dc;
  int local_2d8;
  int32_t step_size;
  int32_t new_bright;
  int32_t curr_bright;
  action_type local_2c4;
  undefined1 local_2c0 [8];
  undefined1 local_2b8 [8];
  multimap<std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>,_candella::action_type,_std::less<std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>_>,_std::allocator<std::pair<const_std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>,_candella::action_type>_>_>
  timer_queue;
  undefined1 local_278 [8];
  ambient_light sensor;
  backlight_adjuster adjuster;
  
  backlight_adjuster::backlight_adjuster((backlight_adjuster *)(sensor.values_._M_elems + 9));
  candella::ambient_light::ambient_light((ambient_light *)local_278,(string *)(config + 0x18));
  std::
  multimap<std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>,_candella::action_type,_std::less<std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>_>,_std::allocator<std::pair<const_std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>,_candella::action_type>_>_>
  ::multimap((multimap<std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>,_candella::action_type,_std::less<std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>_>,_std::allocator<std::pair<const_std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>,_candella::action_type>_>_>
              *)local_2b8);
  local_2c0 = (undefined1  [8])std::chrono::_V2::system_clock::now();
  local_2c4 = BACKLIGHT_POLL;
  __position._M_node = (_Base_ptr)local_2c0;
  _new_bright = std::
                multimap<std::chrono::time_point<std::chrono::_V2::system_clock,std::chrono::duration<long,std::ratio<1l,1000000000l>>>,candella::action_type,std::less<std::chrono::time_point<std::chrono::_V2::system_clock,std::chrono::duration<long,std::ratio<1l,1000000000l>>>>,std::allocator<std::pair<std::chrono::time_point<std::chrono::_V2::system_clock,std::chrono::duration<long,std::ratio<1l,1000000000l>>>const,candella::action_type>>>
                ::
                emplace<std::chrono::time_point<std::chrono::_V2::system_clock,std::chrono::duration<long,std::ratio<1l,1000000000l>>>,candella::action_type>
                          ((multimap<std::chrono::time_point<std::chrono::_V2::system_clock,std::chrono::duration<long,std::ratio<1l,1000000000l>>>,candella::action_type,std::less<std::chrono::time_point<std::chrono::_V2::system_clock,std::chrono::duration<long,std::ratio<1l,1000000000l>>>>,std::allocator<std::pair<std::chrono::time_point<std::chrono::_V2::system_clock,std::chrono::duration<long,std::ratio<1l,1000000000l>>>const,candella::action_type>>>
                            *)local_2b8,
                           (time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                            *)__position._M_node,&local_2c4);
  step_size = 0;
  local_2d8 = 0;
  local_2dc = 0;
  do {
    local_2e8._M_node =
         (_Base_ptr)
         std::
         multimap<std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>,_candella::action_type,_std::less<std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>_>,_std::allocator<std::pair<const_std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>,_candella::action_type>_>_>
         ::begin((multimap<std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>,_candella::action_type,_std::less<std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>_>,_std::allocator<std::pair<const_std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>,_candella::action_type>_>_>
                  *)local_2b8);
    ppVar1 = std::
             _Rb_tree_iterator<std::pair<const_std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>,_candella::action_type>_>
             ::operator->(&local_2e8);
    std::this_thread::
    sleep_until<std::chrono::_V2::system_clock,std::chrono::duration<long,std::ratio<1l,1000000000l>>>
              (&ppVar1->first);
    ambient_light =
         (double)std::
                 multimap<std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>,_candella::action_type,_std::less<std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>_>,_std::allocator<std::pair<const_std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>,_candella::action_type>_>_>
                 ::begin((multimap<std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>,_candella::action_type,_std::less<std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>_>,_std::allocator<std::pair<const_std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>,_candella::action_type>_>_>
                          *)local_2b8);
    ppVar1 = std::
             _Rb_tree_iterator<std::pair<const_std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>,_candella::action_type>_>
             ::operator->((_Rb_tree_iterator<std::pair<const_std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>,_candella::action_type>_>
                           *)&ambient_light);
    if (ppVar1->second == BACKLIGHT_POLL) {
      candella::ambient_light::poll
                ((ambient_light *)local_278,(pollfd *)__position._M_node,__nfds,(int)in_RCX);
      i = extraout_XMM0_Qa;
      poVar2 = std::operator<<((ostream *)&std::cerr,"[info]: Ambient light value was ");
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,(double)i);
      std::operator<<(poVar2,"\n");
      step_size = backlight_adjuster::current_brightness
                            ((backlight_adjuster *)(sensor.values_._M_elems + 9));
      poVar2 = std::operator<<((ostream *)&std::cerr,"[info]: current brightness ");
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,step_size);
      std::operator<<(poVar2,"\n");
      max_brightness =
           backlight_adjuster::max_brightness((backlight_adjuster *)(sensor.values_._M_elems + 9));
      local_2d8 = configuration::desired_brightness
                            ((configuration *)config,max_brightness,(double)i);
      piVar3 = std::max<int>(&local_2d8,(int *)(config + 0x3c));
      local_2d8 = *piVar3;
      if (step_size != local_2d8) {
        poVar2 = std::operator<<((ostream *)&std::cerr,"[info]: Adjusting brightness to ");
        poVar2 = (ostream *)std::ostream::operator<<(poVar2,local_2d8);
        std::operator<<(poVar2,"\n");
        in_RCX = 0;
        local_2dc = (int)((ulong)(long)(local_2d8 - step_size) / (ulong)config._16_8_);
        for (local_300 = 0; local_300 < (ulong)config._16_8_; local_300 = local_300 + 1) {
          local_310.__d.__r = (duration)std::chrono::_V2::system_clock::now();
          local_320 = std::chrono::operator*
                                (&local_300,(duration<long,_std::ratio<1L,_1000L>_> *)(config + 8));
          local_318 = std::chrono::operator/(&local_320,(unsigned_long *)(config + 0x10));
          local_308 = std::chrono::operator+(&local_310,&local_318);
          local_324 = BACKLIGHT_FADE;
          local_330 = (_Base_ptr)
                      std::
                      multimap<std::chrono::time_point<std::chrono::_V2::system_clock,std::chrono::duration<long,std::ratio<1l,1000000000l>>>,candella::action_type,std::less<std::chrono::time_point<std::chrono::_V2::system_clock,std::chrono::duration<long,std::ratio<1l,1000000000l>>>>,std::allocator<std::pair<std::chrono::time_point<std::chrono::_V2::system_clock,std::chrono::duration<long,std::ratio<1l,1000000000l>>>const,candella::action_type>>>
                      ::
                      emplace<std::chrono::time_point<std::chrono::_V2::system_clock,std::chrono::duration<unsigned_long,std::ratio<1l,1000000000l>>>,candella::action_type>
                                ((multimap<std::chrono::time_point<std::chrono::_V2::system_clock,std::chrono::duration<long,std::ratio<1l,1000000000l>>>,candella::action_type,std::less<std::chrono::time_point<std::chrono::_V2::system_clock,std::chrono::duration<long,std::ratio<1l,1000000000l>>>>,std::allocator<std::pair<std::chrono::time_point<std::chrono::_V2::system_clock,std::chrono::duration<long,std::ratio<1l,1000000000l>>>const,candella::action_type>>>
                                  *)local_2b8,&local_308,&local_324);
        }
      }
      local_340.__d.__r = (duration)std::chrono::_V2::system_clock::now();
      local_338 = std::chrono::operator+
                            (&local_340,(duration<long,_std::ratio<1L,_1000L>_> *)config);
      local_344 = BACKLIGHT_POLL;
      local_350 = (_Base_ptr)
                  std::
                  multimap<std::chrono::time_point<std::chrono::_V2::system_clock,std::chrono::duration<long,std::ratio<1l,1000000000l>>>,candella::action_type,std::less<std::chrono::time_point<std::chrono::_V2::system_clock,std::chrono::duration<long,std::ratio<1l,1000000000l>>>>,std::allocator<std::pair<std::chrono::time_point<std::chrono::_V2::system_clock,std::chrono::duration<long,std::ratio<1l,1000000000l>>>const,candella::action_type>>>
                  ::
                  emplace<std::chrono::time_point<std::chrono::_V2::system_clock,std::chrono::duration<long,std::ratio<1l,1000000000l>>>,candella::action_type>
                            ((multimap<std::chrono::time_point<std::chrono::_V2::system_clock,std::chrono::duration<long,std::ratio<1l,1000000000l>>>,candella::action_type,std::less<std::chrono::time_point<std::chrono::_V2::system_clock,std::chrono::duration<long,std::ratio<1l,1000000000l>>>>,std::allocator<std::pair<std::chrono::time_point<std::chrono::_V2::system_clock,std::chrono::duration<long,std::ratio<1l,1000000000l>>>const,candella::action_type>>>
                              *)local_2b8,&local_338,&local_344);
    }
    else {
      local_358._M_node =
           (_Base_ptr)
           std::
           multimap<std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>,_candella::action_type,_std::less<std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>_>,_std::allocator<std::pair<const_std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>,_candella::action_type>_>_>
           ::begin((multimap<std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>,_candella::action_type,_std::less<std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>_>,_std::allocator<std::pair<const_std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>,_candella::action_type>_>_>
                    *)local_2b8);
      ppVar1 = std::
               _Rb_tree_iterator<std::pair<const_std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>,_candella::action_type>_>
               ::operator->(&local_358);
      if (ppVar1->second == BACKLIGHT_FADE) {
        step_size = local_2dc + step_size;
        if ((local_2dc == 0) || (local_2d8 < step_size)) {
          step_size = local_2d8;
        }
        backlight_adjuster::set_brightness
                  ((backlight_adjuster *)(sensor.values_._M_elems + 9),step_size);
        if (step_size != local_2d8) {
          local_368.__d.__r = (duration)std::chrono::_V2::system_clock::now();
          local_370 = std::chrono::operator/
                                ((duration<long,_std::ratio<1L,_1000L>_> *)(config + 8),
                                 (unsigned_long *)(config + 0x10));
          local_360 = std::chrono::operator+(&local_368,&local_370);
          local_374 = BACKLIGHT_FADE;
          std::
          multimap<std::chrono::time_point<std::chrono::_V2::system_clock,std::chrono::duration<long,std::ratio<1l,1000000000l>>>,candella::action_type,std::less<std::chrono::time_point<std::chrono::_V2::system_clock,std::chrono::duration<long,std::ratio<1l,1000000000l>>>>,std::allocator<std::pair<std::chrono::time_point<std::chrono::_V2::system_clock,std::chrono::duration<long,std::ratio<1l,1000000000l>>>const,candella::action_type>>>
          ::
          emplace<std::chrono::time_point<std::chrono::_V2::system_clock,std::chrono::duration<unsigned_long,std::ratio<1l,1000000000l>>>,candella::action_type>
                    ((multimap<std::chrono::time_point<std::chrono::_V2::system_clock,std::chrono::duration<long,std::ratio<1l,1000000000l>>>,candella::action_type,std::less<std::chrono::time_point<std::chrono::_V2::system_clock,std::chrono::duration<long,std::ratio<1l,1000000000l>>>>,std::allocator<std::pair<std::chrono::time_point<std::chrono::_V2::system_clock,std::chrono::duration<long,std::ratio<1l,1000000000l>>>const,candella::action_type>>>
                      *)local_2b8,&local_360,&local_374);
        }
      }
    }
    __position = std::
                 multimap<std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>,_candella::action_type,_std::less<std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>_>,_std::allocator<std::pair<const_std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>,_candella::action_type>_>_>
                 ::begin((multimap<std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>,_candella::action_type,_std::less<std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>_>,_std::allocator<std::pair<const_std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>,_candella::action_type>_>_>
                          *)local_2b8);
    std::
    multimap<std::chrono::time_point<std::chrono::_V2::system_clock,std::chrono::duration<long,std::ratio<1l,1000000000l>>>,candella::action_type,std::less<std::chrono::time_point<std::chrono::_V2::system_clock,std::chrono::duration<long,std::ratio<1l,1000000000l>>>>,std::allocator<std::pair<std::chrono::time_point<std::chrono::_V2::system_clock,std::chrono::duration<long,std::ratio<1l,1000000000l>>>const,candella::action_type>>>
    ::erase_abi_cxx11_((multimap<std::chrono::time_point<std::chrono::_V2::system_clock,std::chrono::duration<long,std::ratio<1l,1000000000l>>>,candella::action_type,std::less<std::chrono::time_point<std::chrono::_V2::system_clock,std::chrono::duration<long,std::ratio<1l,1000000000l>>>>,std::allocator<std::pair<std::chrono::time_point<std::chrono::_V2::system_clock,std::chrono::duration<long,std::ratio<1l,1000000000l>>>const,candella::action_type>>>
                        *)local_2b8,__position);
  } while( true );
}

Assistant:

void loop()
{
    backlight_adjuster adjuster;
    ambient_light sensor{config.light_sensor};

    using steady_clock = std::chrono::system_clock;
    std::multimap<steady_clock::time_point, action_type> timer_queue;
    timer_queue.emplace(steady_clock::now(), action_type::BACKLIGHT_POLL);

    int32_t curr_bright = 0;
    int32_t new_bright = 0;
    int32_t step_size = 0;

    while (true)
    {
        std::this_thread::sleep_until(timer_queue.begin()->first);
        if (timer_queue.begin()->second == action_type::BACKLIGHT_POLL)
        {
            // read the current ambient light value
            auto ambient_light = sensor.poll();
            std::cerr << "[info]: Ambient light value was " << ambient_light
                      << "\n";

            // read the current backlight value
            curr_bright = adjuster.current_brightness();
            std::cerr << "[info]: current brightness " << curr_bright << "\n";

            // calculate the new brightness value
            new_bright = config.desired_brightness(adjuster.max_brightness(),
                                                   ambient_light);

            new_bright = std::max(new_bright, config.min_bright);

            if (curr_bright != new_bright)
            {
                std::cerr << "[info]: Adjusting brightness to " << new_bright
                          << "\n";
                step_size = (new_bright - curr_bright) / config.fade_steps;
                for (std::size_t i = 0; i < config.fade_steps; ++i)
                {
                    timer_queue.emplace(steady_clock::now()
                                            + i * config.fade_time
                                                  / config.fade_steps,
                                        action_type::BACKLIGHT_FADE);
                }
            }
            timer_queue.emplace(steady_clock::now() + config.poll_time,
                                action_type::BACKLIGHT_POLL);
        }
        else if (timer_queue.begin()->second == action_type::BACKLIGHT_FADE)
        {
            curr_bright += step_size;
            if (step_size == 0 || curr_bright > new_bright)
                curr_bright = new_bright;

            adjuster.set_brightness(curr_bright);
            if (curr_bright != new_bright)
            {
                timer_queue.emplace(steady_clock::now()
                                        + config.fade_time / config.fade_steps,
                                    action_type::BACKLIGHT_FADE);
            }
        }
        timer_queue.erase(timer_queue.begin());
    }
}